

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

void __thiscall
cfd::core::AbstractTransaction::SetTxInSequence
          (AbstractTransaction *this,uint32_t tx_in_index,uint32_t sequence)

{
  CfdException *this_00;
  allocator local_59;
  string local_58;
  CfdSourceLocation local_38;
  void *local_20;
  wally_tx *tx_pointer;
  uint32_t sequence_local;
  uint32_t tx_in_index_local;
  AbstractTransaction *this_local;
  
  tx_pointer._0_4_ = sequence;
  tx_pointer._4_4_ = tx_in_index;
  _sequence_local = this;
  (*this->_vptr_AbstractTransaction[0xb])(this,(ulong)tx_in_index,400,"SetTxInSequence");
  local_20 = this->wally_tx_pointer_;
  if ((local_20 != (void *)0x0) && (tx_pointer._4_4_ < (uint)*(undefined8 *)((long)local_20 + 0x10))
     ) {
    *(uint32_t *)(*(long *)((long)local_20 + 8) + (ulong)tx_pointer._4_4_ * 0xd0 + 0x24) =
         (uint32_t)tx_pointer;
    return;
  }
  local_38.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_transaction_common.cpp"
               ,0x2f);
  local_38.filename = local_38.filename + 1;
  local_38.line = 0x196;
  local_38.funcname = "SetTxInSequence";
  logger::warn<>(&local_38,"wally invalid state.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_58,"wally invalid state error.",&local_59);
  CfdException::CfdException(this_00,kCfdIllegalStateError,&local_58);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void AbstractTransaction::SetTxInSequence(
    uint32_t tx_in_index, uint32_t sequence) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if ((tx_pointer == nullptr) ||
      (static_cast<uint32_t>(tx_pointer->num_inputs) <= tx_in_index)) {
    warn(CFD_LOG_SOURCE, "wally invalid state.");
    throw CfdException(kCfdIllegalStateError, "wally invalid state error.");
  }
  tx_pointer->inputs[tx_in_index].sequence = sequence;
}